

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Bus_SclObjUpdateDept(Abc_Obj_t *p,float time)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)p->Id;
  if ((-1 < lVar3) && (lVar2 = *(long *)((long)p->pNtk->pBSMan + 0x50), p->Id < *(int *)(lVar2 + 4))
     ) {
    lVar2 = *(long *)(lVar2 + 8);
    pfVar1 = (float *)(lVar2 + lVar3 * 4);
    if (*pfVar1 <= time && time != *pfVar1) {
      *(float *)(lVar2 + lVar3 * 4) = time;
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ,0x173,"float *Vec_FltEntryP(Vec_Flt_t *, int)");
}

Assistant:

static inline unsigned    Abc_ObjId( Abc_Obj_t * pObj )              { return pObj->Id;                 }